

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::Kernel::Clear(Kernel *this)

{
  clear_kernel(this);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void Kernel::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.Kernel)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  clear_kernel();
  _internal_metadata_.Clear<std::string>();
}